

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O0

void Bac_NtkUpdateFanout(Bac_Ntk_t *p,int iOld,int iNew)

{
  int iVar1;
  int local_1c;
  int iCo;
  int iNew_local;
  int iOld_local;
  Bac_Ntk_t *p_local;
  
  iVar1 = Bac_ObjIsCi(p,iOld);
  if (iVar1 == 0) {
    __assert_fail("Bac_ObjIsCi(p, iOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacNtk.c"
                  ,0xda,"void Bac_NtkUpdateFanout(Bac_Ntk_t *, int, int)");
  }
  iVar1 = Bac_ObjIsCi(p,iNew);
  if (iVar1 != 0) {
    local_1c = Bac_ObjFanout(p,iOld);
    while( true ) {
      if (local_1c == 0) {
        iVar1 = Bac_ObjFanout(p,iOld);
        Bac_ObjSetFanout(p,iNew,iVar1);
        Bac_ObjSetFanout(p,iOld,0);
        return;
      }
      iVar1 = Bac_ObjFanin(p,local_1c);
      if (iVar1 != iOld) break;
      Bac_ObjCleanFanin(p,local_1c);
      Bac_ObjSetFanin(p,local_1c,iNew);
      local_1c = Bac_ObjNextFanout(p,local_1c);
    }
    __assert_fail("Bac_ObjFanin(p, iCo) == iOld",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacNtk.c"
                  ,0xde,"void Bac_NtkUpdateFanout(Bac_Ntk_t *, int, int)");
  }
  __assert_fail("Bac_ObjIsCi(p, iNew)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacNtk.c"
                ,0xdb,"void Bac_NtkUpdateFanout(Bac_Ntk_t *, int, int)");
}

Assistant:

void Bac_NtkUpdateFanout( Bac_Ntk_t * p, int iOld, int iNew )
{
    int iCo;
    assert( Bac_ObjIsCi(p, iOld) );
    assert( Bac_ObjIsCi(p, iNew) );
    Bac_ObjForEachFanout( p, iOld, iCo )
    {
        assert( Bac_ObjFanin(p, iCo) == iOld );
        Bac_ObjCleanFanin( p, iCo );
        Bac_ObjSetFanin( p, iCo, iNew );
    }
    Bac_ObjSetFanout( p, iNew, Bac_ObjFanout(p, iOld) );
    Bac_ObjSetFanout( p, iOld, 0 );
}